

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Session::Session(Session *this)

{
  bool bVar1;
  int iVar2;
  IRegistryHub *pIVar3;
  undefined4 extraout_var;
  IMutableContext *pIVar4;
  ostream *poVar5;
  NonCopyable *in_RDI;
  undefined1 auVar6 [12];
  exception *ex;
  exception_ptr *ex_ptr;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>
  *__range2;
  Colour colourGuard;
  vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>
  *exceptions;
  ConfigData *in_stack_00002e38;
  undefined4 in_stack_fffffffffffffde8;
  Code in_stack_fffffffffffffdec;
  ConfigData *in_stack_fffffffffffffdf0;
  Session *in_stack_fffffffffffffe00;
  string *in_stack_fffffffffffffe10;
  ReusableStringStream *in_stack_fffffffffffffe20;
  ConfigData *in_stack_fffffffffffffe30;
  undefined1 *puVar7;
  undefined1 local_a8 [8];
  reference local_a0;
  exception_ptr *local_98;
  __normal_iterator<const_std::__exception_ptr::exception_ptr_*,_std::vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>_>
  local_90;
  vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>
  *local_88;
  undefined1 local_78 [16];
  vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>
  *local_68;
  SourceLineInfo local_60 [4];
  undefined4 local_14;
  undefined8 local_10;
  
  NonCopyable::NonCopyable(in_RDI);
  in_RDI->_vptr_NonCopyable = (_func_int **)&PTR__Session_00247168;
  clara::detail::Parser::Parser((Parser *)in_stack_fffffffffffffe00);
  ConfigData::ConfigData(in_stack_fffffffffffffe30);
  clara::std::shared_ptr<Catch::Config>::shared_ptr((shared_ptr<Catch::Config> *)0x131210);
  *(undefined1 *)&in_RDI[0x31]._vptr_NonCopyable = 0;
  if ((Session::alreadyInstantiated & 1U) != 0) {
    ReusableStringStream::ReusableStringStream(in_stack_fffffffffffffe20);
    SourceLineInfo::SourceLineInfo
              (local_60,
               "/workspace/llm4binary/github/license_all_cmakelists_25/olegtarasov[P]fastText/src/catch.hpp"
               ,0x3465);
    ReusableStringStream::operator<<
              ((ReusableStringStream *)in_stack_fffffffffffffdf0,
               (SourceLineInfo *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
    ReusableStringStream::operator<<
              ((ReusableStringStream *)in_stack_fffffffffffffdf0,
               (char (*) [26])CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
    ReusableStringStream::operator<<
              ((ReusableStringStream *)in_stack_fffffffffffffdf0,
               (char (*) [53])CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
    ReusableStringStream::str_abi_cxx11_
              ((ReusableStringStream *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8)
              );
    throw_logic_error(in_stack_fffffffffffffe10);
  }
  pIVar3 = getRegistryHub();
  iVar2 = (*pIVar3->_vptr_IRegistryHub[6])();
  local_68 = StartupExceptionRegistry::getExceptions
                       ((StartupExceptionRegistry *)CONCAT44(extraout_var,iVar2));
  bVar1 = clara::std::
          vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>
          ::empty((vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>
                   *)in_stack_fffffffffffffe00);
  if (!bVar1) {
    config(in_stack_fffffffffffffe00);
    pIVar4 = getCurrentMutableContext();
    puVar7 = local_78;
    std::shared_ptr<Catch::IConfig_const>::shared_ptr<Catch::Config,void>
              ((shared_ptr<const_Catch::IConfig> *)in_stack_fffffffffffffdf0,
               (shared_ptr<Catch::Config> *)
               CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
    (*(pIVar4->super_IContext)._vptr_IContext[7])(pIVar4,puVar7);
    clara::std::shared_ptr<const_Catch::IConfig>::~shared_ptr
              ((shared_ptr<const_Catch::IConfig> *)0x13146e);
    *(undefined1 *)&in_RDI[0x31]._vptr_NonCopyable = 1;
    Colour::Colour((Colour *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec);
    poVar5 = cerr();
    poVar5 = std::operator<<(poVar5,"Errors occurred during startup!");
    std::operator<<(poVar5,'\n');
    local_88 = local_68;
    local_90._M_current =
         (exception_ptr *)
         clara::std::
         vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>
         ::begin((vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>
                  *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
    local_98 = (exception_ptr *)
               clara::std::
               vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>
               ::end((vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>
                      *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::__exception_ptr::exception_ptr_*,_std::vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>_>
                        *)in_stack_fffffffffffffdf0,
                       (__normal_iterator<const_std::__exception_ptr::exception_ptr_*,_std::vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>_>
                        *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
    if (bVar1) {
      local_a0 = __gnu_cxx::
                 __normal_iterator<const_std::__exception_ptr::exception_ptr_*,_std::vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>_>
                 ::operator*(&local_90);
      clara::std::__exception_ptr::exception_ptr::exception_ptr
                ((exception_ptr *)in_stack_fffffffffffffdf0,
                 (exception_ptr *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
      auVar6 = std::rethrow_exception((exception_ptr)local_a8);
      local_14 = auVar6._8_4_;
      local_10 = auVar6._0_8_;
      clara::std::shared_ptr<const_Catch::IConfig>::~shared_ptr
                ((shared_ptr<const_Catch::IConfig> *)0x13157a);
      clara::std::shared_ptr<Catch::Config>::~shared_ptr((shared_ptr<Catch::Config> *)0x1317cb);
      ConfigData::~ConfigData(in_stack_fffffffffffffdf0);
      clara::detail::Parser::~Parser((Parser *)in_stack_fffffffffffffdf0);
      NonCopyable::~NonCopyable(in_RDI);
      _Unwind_Resume(local_10);
    }
    Colour::~Colour((Colour *)0x13175d);
  }
  Session::alreadyInstantiated = true;
  makeCommandLineParser(in_stack_00002e38);
  clara::detail::Parser::operator=
            ((Parser *)in_stack_fffffffffffffdf0,
             (Parser *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
  clara::detail::Parser::~Parser((Parser *)in_stack_fffffffffffffdf0);
  return;
}

Assistant:

Session::Session() {
        static bool alreadyInstantiated = false;
        if( alreadyInstantiated ) {
            CATCH_TRY { CATCH_INTERNAL_ERROR( "Only one instance of Catch::Session can ever be used" ); }
            CATCH_CATCH_ALL { getMutableRegistryHub().registerStartupException(); }